

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

token * dmrC_parens_expression(dmr_C *C,token *token,expression **expr,char *where)

{
  token *ptVar1;
  expression *peVar2;
  statement *stmt;
  
  ptVar1 = dmrC_expect_token(C,token,0x28,where);
  if (((SUB84(ptVar1->pos,0) & 0x3f) == 0x11) && ((ptVar1->field_2).special == 0x7b)) {
    peVar2 = dmrC_alloc_expression(C,ptVar1->pos,0x13);
    stmt = dmrC_alloc_statement(C,ptVar1->pos,3);
    *expr = peVar2;
    (peVar2->field_5).statement = stmt;
    dmrC_start_symbol_scope(C);
    ptVar1 = dmrC_compound_statement(C,ptVar1->next,stmt);
    dmrC_end_symbol_scope(C);
    ptVar1 = dmrC_expect_token(C,ptVar1,0x7d,"at end of statement expression");
  }
  else {
    ptVar1 = comma_expression(C,ptVar1,expr);
  }
  ptVar1 = dmrC_expect_token(C,ptVar1,0x29,where);
  return ptVar1;
}

Assistant:

struct token *dmrC_parens_expression(struct dmr_C *C, struct token *token, struct expression **expr, const char *where)
{
	token = dmrC_expect_token(C, token, '(', where);
	if (dmrC_match_op(token, '{')) {
		struct expression *e = dmrC_alloc_expression(C, token->pos, EXPR_STATEMENT);
		struct statement *stmt = dmrC_alloc_statement(C, token->pos, STMT_COMPOUND);
		*expr = e;
		e->statement = stmt;
		dmrC_start_symbol_scope(C);
		token = dmrC_compound_statement(C, token->next, stmt);
		dmrC_end_symbol_scope(C);
		token = dmrC_expect_token(C, token, '}', "at end of statement expression");
	} else
		token = dmrC_parse_expression(C, token, expr);
	return dmrC_expect_token(C, token, ')', where);
}